

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexStats.cpp
# Opt level: O2

void __thiscall UnifiedRegex::RegexStatsDatabase::Print(RegexStatsDatabase *this,DebugWriter *w)

{
  int iVar1;
  RegexStats **ppRVar2;
  int iVar3;
  BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  int i;
  int iVar4;
  undefined1 local_a8 [8];
  RegexStats totals;
  
  iVar4 = 0;
  RegexStats::RegexStats((RegexStats *)local_a8,(RegexPattern *)0x0);
  Output::Print(L"Regular Expression Statistics\n");
  Output::Print(L"=============================\n");
  while( true ) {
    this_00 = this->map;
    iVar1 = this_00->count;
    iVar3 = this_00->freeCount;
    if (iVar1 - iVar3 <= iVar4) break;
    ppRVar2 = JsUtil::
              BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
              ::GetValueAt(this_00,iVar4);
    RegexStats::Add((RegexStats *)local_a8,*ppRVar2);
    iVar4 = iVar4 + 1;
  }
  for (iVar4 = 0; iVar4 < iVar1 - iVar3; iVar4 = iVar4 + 1) {
    ppRVar2 = JsUtil::
              BaseDictionary<Js::InternalString,_UnifiedRegex::RegexStats_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
              ::GetValueAt(this_00,iVar4);
    RegexStats::Print(*ppRVar2,w,(RegexStats *)local_a8,this->ticksPerMillisecond);
    this_00 = this->map;
    iVar1 = this_00->count;
    iVar3 = this_00->freeCount;
  }
  RegexStats::Print((RegexStats *)local_a8,w,(RegexStats *)0x0,this->ticksPerMillisecond);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            (&this->allocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,w,0x1008);
  return;
}

Assistant:

void RegexStatsDatabase::Print(DebugWriter* w)
    {
        RegexStats totals(0);

        Output::Print(_u("Regular Expression Statistics\n"));
        Output::Print(_u("=============================\n"));

        for (int i = 0; i < map->Count(); i++)
            totals.Add(map->GetValueAt(i));

        for (int i = 0; i < map->Count(); i++)
            map->GetValueAt(i)->Print(w, &totals, ticksPerMillisecond);

        totals.Print(w, 0, ticksPerMillisecond);

        allocator->Free(w, sizeof(DebugWriter));
    }